

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_write_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,void *array
              ,void *nullval,int *status)

{
  int bytesperpixel;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int naxis;
  long local_118;
  long nread;
  long local_108 [6];
  undefined1 local_d8 [16];
  long local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  ulong local_a0;
  long naxes [6];
  LONGLONG dimsize [6];
  
  if (0 < *status) {
    return *status;
  }
  bytesperpixel = ffpxsz(datatype);
  local_d8 = ZEXT816(0);
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  lVar1 = 0;
  do {
    naxes[lVar1] = 1;
    naxes[lVar1 + 1] = 1;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 6);
  ffgidm(fptr,&naxis,status);
  ffgisz(fptr,6,naxes,status);
  dimsize[0] = 1;
  lVar1 = 1;
  lVar3 = 0;
  do {
    lVar1 = lVar1 * naxes[lVar3];
    dimsize[lVar3 + 1] = lVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  if (0 < (long)naxis) {
    lVar1 = fpixel + npixel + -2;
    lVar3 = fpixel + -1;
    uVar5 = (long)naxis + 1;
    do {
      lVar4 = naxes[uVar5 + 4];
      lVar2 = lVar3 / lVar4;
      lVar3 = lVar3 % lVar4;
      local_108[uVar5 + 4] = lVar2;
      lVar2 = lVar1 / lVar4;
      lVar1 = lVar1 % lVar4;
      (&local_118)[uVar5] = lVar2;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  lVar1 = local_108[2];
  if (naxis == 3) {
    local_118 = local_108[0];
    if (((local_d8._8_8_ != 0 || local_d8._0_8_ != 0) || (local_108[0] != naxes[0] + -1)) ||
       (local_108[1] != naxes[1] + -1)) {
      local_a8 = local_108[1];
      if (local_c8 < local_108[2]) {
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        local_108[0] = naxes[0] + -1;
        local_108[1] = auVar7._8_8_ + naxes[1];
      }
      if (local_c8 <= local_108[2]) {
        lVar3 = local_108[2] + 1;
        lVar4 = local_c8;
        local_a0 = (ulong)(uint)nullcheck;
        do {
          if (lVar1 == lVar4) {
            local_108[0] = local_118;
            local_108[1] = local_a8;
          }
          fits_write_compressed_img_plane
                    (fptr,datatype,bytesperpixel,lVar4,(long *)local_d8,local_108,naxes,
                     (int)local_a0,array,nullval,&nread,status);
          local_d8 = (undefined1  [16])0x0;
          array = (void *)((long)array + nread * bytesperpixel);
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      goto LAB_001cd743;
    }
    lVar1 = 0;
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    do {
      lVar3 = *(long *)(local_d8 + lVar1 * 8 + 8);
      *(long *)(local_d8 + lVar1 * 8) = *(long *)(local_d8 + lVar1 * 8) + 1;
      *(long *)(local_d8 + lVar1 * 8 + 8) = lVar3 - auVar6._8_8_;
      local_108[lVar1] = local_108[lVar1] + 1;
      local_108[lVar1 + 1] = local_108[lVar1 + 1] - auVar6._8_8_;
      lVar1 = lVar1 + 2;
    } while (lVar1 != 6);
  }
  else {
    if (naxis == 2) {
      fits_write_compressed_img_plane
                (fptr,datatype,bytesperpixel,0,(long *)local_d8,local_108,naxes,nullcheck,array,
                 nullval,&nread,status);
LAB_001cd743:
      return *status;
    }
    if (naxis != 1) {
      ffpmsg("only 1D, 2D, or 3D images are currently supported");
      *status = 0x19d;
      return 0x19d;
    }
    local_d8._0_8_ = local_d8._0_8_ + 1;
    local_108[0] = local_108[0] + 1;
  }
  fits_write_compressed_img(fptr,datatype,(long *)local_d8,local_108,nullcheck,array,nullval,status)
  ;
  return *status;
}

Assistant:

int fits_write_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer   */
            int  datatype,  /* I - datatype of the array to be written      */
            LONGLONG   fpixel,  /* I - 'first pixel to write          */
            LONGLONG   npixel,  /* I - number of pixels to write      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,      /* I - array of values to write                */
            void *nullval,    /* I - value used to represent undefined pixels*/
            int  *status)     /* IO - error status                           */
/*
   Write a consecutive set of pixels to a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to write compressed images in
   general, and could be rather inefficient if the requested pixels to be
   written are located in many different image compression tiles.    

   The general strategy used here is to write the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel;
    long naxes[MAX_COMPRESS_DIM], nread;
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    long nplane, firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
    }

    /*  determine the dimensions of the image to be written */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = (long) (tfirst / dimsize[ii]);
        lastcoord[ii]  = (long) (tlast / dimsize[ii]);
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just write the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
            nullcheck, array, nullval, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* write 1st (and only) plane of the image */
        fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, naxes, nullcheck,
          array, nullval, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: writing an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can write the contiguous block of pixels in one go */
            fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
                nullcheck, array, nullval, status);
            return(*status);
        }

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will write up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* write one plane of the cube at a time, for simplicity */
        for (nplane = firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = (long) last0;
                lastcoord[1] = (long) last1;
            }

            fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, naxes, nullcheck,
              arrayptr, nullval, &nread, status);

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be written */
            arrayptr = arrayptr + nread * bytesperpixel;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_COMPRESSION_ERR);
    }

    return(*status);
}